

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::Mine::Mine(Mine *this,Vector *Location,KUINT16 ID)

{
  KUINT16 ID_local;
  Vector *Location_local;
  Mine *this_local;
  
  MinefieldDataFilter::MinefieldDataFilter(&this->super_MinefieldDataFilter);
  (this->super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__Mine_00332160;
  Vector::Vector(&this->m_Loc,Location);
  this->m_ui16ID = ID;
  this->m_f32GrndOffset = 0.0;
  this->m_f32WtrOffset = 0.0;
  this->m_f32SnwOffset = 0.0;
  EulerAngles::EulerAngles(&this->m_Ori);
  this->m_f32ThrmCont = 0.0;
  this->m_f32Rflt = 0.0;
  ClockTime::ClockTime(&this->m_MET);
  MineFusing::MineFusing(&this->m_MF);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vui8SDC);
  MinePaintScheme::MinePaintScheme(&this->m_MPS);
  this->m_ui8NumTrpDetWrs = '\0';
  std::
  map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
  ::map(&this->m_mvVertices);
  this->m_ui16NextIndex = 0;
  return;
}

Assistant:

Mine::Mine( const Vector & Location, KUINT16 ID ) :
    m_Loc( Location ),
    m_ui16ID( ID ),
    m_f32GrndOffset( 0 ),
    m_f32WtrOffset( 0 ),
    m_f32SnwOffset( 0 ),
    m_f32ThrmCont( 0 ),
    m_f32Rflt( 0 ),
    m_ui8NumTrpDetWrs( 0 ),
    m_ui16NextIndex( 0 )
{
}